

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

int map_get(pMap map,size_t key,void *value)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = map->count;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (uVar1 == uVar3) goto LAB_00103a58;
    uVar2 = uVar3 + 1;
  } while (map->keys[uVar3] != key);
  memcpy(value,(void *)(uVar3 * map->value_size + (long)map->values),map->value_size);
LAB_00103a58:
  return (uVar3 < uVar1) - 1;
}

Assistant:

int map_get(pMap map, size_t key, void *value)
{
    for (int i = 0; i < map->count; i++)
    {
        if (map->keys[i] == key)
        {
            memcpy(value, map->values + i * map->value_size, map->value_size);
            return MAP_SUCCESS;
        }
    }
    return MAP_FAILED;
}